

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

void iCopyColors<cRGB555,cBGRA,bReverseSubtract>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  FSpecialColormap *pFVar4;
  EBlend EVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  BYTE BVar15;
  uint uVar16;
  
  pFVar4 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
    EVar5 = BLEND_NONE;
  }
  else {
    EVar5 = inf->blend;
  }
  switch(EVar5) {
  case BLEND_NONE:
    if (0 < count) {
      lVar6 = 0;
      do {
        iVar8 = (*(ushort *)pin & 0x1f) * 8 * inf->alpha + (uint)pout[lVar6 * 4 + 2] * -0x10000;
        if (iVar8 >> 0x10 < 1) {
          iVar8 = 0;
        }
        pout[lVar6 * 4 + 2] = (BYTE)((uint)iVar8 >> 0x10);
        iVar8 = (*(ushort *)pin >> 2 & 0xf8) * inf->alpha + (uint)pout[lVar6 * 4 + 1] * -0x10000;
        if (iVar8 >> 0x10 < 1) {
          iVar8 = 0;
        }
        pout[lVar6 * 4 + 1] = (BYTE)((uint)iVar8 >> 0x10);
        iVar8 = (*(ushort *)pin >> 7 & 0xf8) * inf->alpha + (uint)pout[lVar6 * 4] * -0x10000;
        if (iVar8 >> 0x10 < 1) {
          iVar8 = 0;
        }
        pout[lVar6 * 4] = (BYTE)((uint)iVar8 >> 0x10);
        pout[lVar6 * 4 + 3] = 0xff;
        pin = (BYTE *)((long)pin + (long)step);
        lVar6 = lVar6 + 1;
      } while (count != (int)lVar6);
    }
    break;
  case BLEND_ICEMAP:
    if (0 < count) {
      lVar6 = 0;
      do {
        uVar3 = *(ushort *)pin;
        uVar11 = (uVar3 >> 2 & 0xf8) * 0x8f + ((uint)uVar3 * 8 & 0xff) * 0x4d +
                 (uVar3 >> 7 & 0xf8) * 0x24 >> 0xc;
        iVar8 = (uint)IcePalette[uVar11][0] * inf->alpha + (uint)pout[lVar6 * 4 + 2] * -0x10000;
        BVar15 = (BYTE)((uint)iVar8 >> 0x10);
        if (iVar8 >> 0x10 < 1) {
          BVar15 = '\0';
        }
        pout[lVar6 * 4 + 2] = BVar15;
        iVar8 = (uint)IcePalette[uVar11][1] * inf->alpha + (uint)pout[lVar6 * 4 + 1] * -0x10000;
        BVar15 = (BYTE)((uint)iVar8 >> 0x10);
        if (iVar8 >> 0x10 < 1) {
          BVar15 = '\0';
        }
        pout[lVar6 * 4 + 1] = BVar15;
        iVar8 = (uint)IcePalette[uVar11][2] * inf->alpha + (uint)pout[lVar6 * 4] * -0x10000;
        BVar15 = (BYTE)((uint)iVar8 >> 0x10);
        if (iVar8 >> 0x10 < 1) {
          BVar15 = '\0';
        }
        pout[lVar6 * 4] = BVar15;
        pout[lVar6 * 4 + 3] = 0xff;
        pin = (BYTE *)((long)pin + (long)step);
        lVar6 = lVar6 + 1;
      } while (count != (int)lVar6);
    }
    break;
  case BLEND_OVERLAY:
    if (0 < count) {
      lVar6 = 0;
      do {
        uVar3 = *(ushort *)pin;
        iVar8 = inf->blendcolor[3];
        iVar9 = inf->blendcolor[1];
        iVar12 = inf->blendcolor[2];
        iVar14 = (((uint)uVar3 * 8 & 0xff) * iVar8 + inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha
                 + (uint)pout[lVar6 * 4 + 2] * -0x10000;
        BVar15 = (BYTE)((uint)iVar14 >> 0x10);
        if (iVar14 >> 0x10 < 1) {
          BVar15 = '\0';
        }
        pout[lVar6 * 4 + 2] = BVar15;
        iVar9 = ((uVar3 >> 2 & 0xf8) * iVar8 + iVar9 >> 0x10 & 0xff) * inf->alpha +
                (uint)pout[lVar6 * 4 + 1] * -0x10000;
        BVar15 = (BYTE)((uint)iVar9 >> 0x10);
        if (iVar9 >> 0x10 < 1) {
          BVar15 = '\0';
        }
        pout[lVar6 * 4 + 1] = BVar15;
        iVar8 = ((uVar3 >> 7 & 0xf8) * iVar8 + iVar12 >> 0x10 & 0xff) * inf->alpha +
                (uint)pout[lVar6 * 4] * -0x10000;
        BVar15 = (BYTE)((uint)iVar8 >> 0x10);
        if (iVar8 >> 0x10 < 1) {
          BVar15 = '\0';
        }
        pout[lVar6 * 4] = BVar15;
        pout[lVar6 * 4 + 3] = 0xff;
        pin = (BYTE *)((long)pin + (long)step);
        lVar6 = lVar6 + 1;
      } while (count != (int)lVar6);
    }
    break;
  case BLEND_MODULATE:
    if (0 < count) {
      lVar6 = 0;
      do {
        uVar3 = *(ushort *)pin;
        iVar8 = (((uint)uVar3 * 8 & 0xff) * inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha +
                (uint)pout[lVar6 * 4 + 2] * -0x10000;
        if (iVar8 >> 0x10 < 1) {
          iVar8 = 0;
        }
        iVar9 = inf->blendcolor[1];
        iVar12 = inf->blendcolor[2];
        pout[lVar6 * 4 + 2] = (BYTE)((uint)iVar8 >> 0x10);
        iVar8 = ((uVar3 >> 2 & 0xf8) * iVar9 >> 0x10 & 0xff) * inf->alpha +
                (uint)pout[lVar6 * 4 + 1] * -0x10000;
        if (iVar8 >> 0x10 < 1) {
          iVar8 = 0;
        }
        pout[lVar6 * 4 + 1] = (BYTE)((uint)iVar8 >> 0x10);
        iVar8 = ((uVar3 >> 7 & 0xf8) * iVar12 >> 0x10 & 0xff) * inf->alpha +
                (uint)pout[lVar6 * 4] * -0x10000;
        if (iVar8 >> 0x10 < 1) {
          iVar8 = 0;
        }
        pout[lVar6 * 4] = (BYTE)((uint)iVar8 >> 0x10);
        pout[lVar6 * 4 + 3] = 0xff;
        pin = (BYTE *)((long)pin + (long)step);
        lVar6 = lVar6 + 1;
      } while (count != (int)lVar6);
    }
    break;
  default:
    EVar5 = inf->blend;
    lVar6 = (long)EVar5;
    if (lVar6 < 0x21) {
      if ((BLEND_ICEMAP < EVar5) && (0 < count)) {
        iVar8 = 0x20 - EVar5;
        lVar6 = 0;
        do {
          uVar3 = *(ushort *)pin;
          uVar11 = (uint)uVar3 * 8 & 0xff;
          uVar13 = uVar3 >> 2 & 0xf8;
          uVar16 = uVar3 >> 7 & 0xf8;
          iVar9 = (uVar13 * 0x8f + uVar11 * 0x4d + uVar16 * 0x24 >> 8) * (EVar5 + BLEND_MODULATE);
          iVar12 = uVar11 * iVar8 + iVar9;
          iVar14 = uVar13 * iVar8 + iVar9;
          iVar9 = uVar16 * iVar8 + iVar9;
          iVar12 = ((uint)((ulong)((long)iVar12 * 0x84210843) >> 0x24) - (iVar12 >> 0x1f) & 0xff) *
                   inf->alpha + (uint)pout[lVar6 * 4 + 2] * -0x10000;
          BVar15 = (BYTE)((uint)iVar12 >> 0x10);
          if (iVar12 >> 0x10 < 1) {
            BVar15 = '\0';
          }
          pout[lVar6 * 4 + 2] = BVar15;
          iVar12 = ((uint)((ulong)((long)iVar14 * 0x84210843) >> 0x24) - (iVar14 >> 0x1f) & 0xff) *
                   inf->alpha + (uint)pout[lVar6 * 4 + 1] * -0x10000;
          BVar15 = (BYTE)((uint)iVar12 >> 0x10);
          if (iVar12 >> 0x10 < 1) {
            BVar15 = '\0';
          }
          pout[lVar6 * 4 + 1] = BVar15;
          iVar9 = ((uint)((ulong)((long)iVar9 * 0x84210843) >> 0x24) - (iVar9 >> 0x1f) & 0xff) *
                  inf->alpha + (uint)pout[lVar6 * 4] * -0x10000;
          BVar15 = (BYTE)((uint)iVar9 >> 0x10);
          if (iVar9 >> 0x10 < 1) {
            BVar15 = '\0';
          }
          pout[lVar6 * 4] = BVar15;
          pout[lVar6 * 4 + 3] = 0xff;
          pin = (BYTE *)((long)pin + (long)step);
          lVar6 = lVar6 + 1;
        } while (count != (int)lVar6);
      }
    }
    else if (0 < count) {
      lVar10 = 0;
      do {
        uVar3 = *(ushort *)pin;
        uVar11 = (uVar3 >> 2 & 0xf8) * 0x8f + ((uint)uVar3 * 8 & 0xff) * 0x4d +
                 (uVar3 >> 7 & 0xf8) * 0x24;
        uVar13 = uVar11 >> 8;
        uVar7 = (ulong)uVar13;
        if (0xfe < uVar13) {
          uVar7 = 0xff;
        }
        if (uVar11 < 0x100) {
          uVar7 = 0;
        }
        iVar8 = (uint)*(byte *)((long)pFVar4 + uVar7 * 4 + lVar6 * 0x518 + -0xa6fe) * inf->alpha +
                (uint)pout[lVar10 * 4 + 2] * -0x10000;
        if (iVar8 >> 0x10 < 1) {
          iVar8 = 0;
        }
        bVar1 = *(byte *)((long)pFVar4 + uVar7 * 4 + lVar6 * 0x518 + -0xa700);
        bVar2 = *(byte *)((long)pFVar4 + uVar7 * 4 + lVar6 * 0x518 + -0xa6ff);
        pout[lVar10 * 4 + 2] = (BYTE)((uint)iVar8 >> 0x10);
        iVar8 = (uint)bVar2 * inf->alpha + (uint)pout[lVar10 * 4 + 1] * -0x10000;
        if (iVar8 >> 0x10 < 1) {
          iVar8 = 0;
        }
        pout[lVar10 * 4 + 1] = (BYTE)((uint)iVar8 >> 0x10);
        iVar8 = (uint)bVar1 * inf->alpha + (uint)pout[lVar10 * 4] * -0x10000;
        if (iVar8 >> 0x10 < 1) {
          iVar8 = 0;
        }
        pout[lVar10 * 4] = (BYTE)((uint)iVar8 >> 0x10);
        pout[lVar10 * 4 + 3] = 0xff;
        pin = (BYTE *)((long)pin + (long)step);
        lVar10 = lVar10 + 1;
      } while (count != (int)lVar10);
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}